

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_trimchar(char *dest,int dest_sz,char *src,char trim_ch)

{
  int iVar1;
  int local_40;
  int local_3c;
  int local_38;
  int i;
  int offset;
  int var__b;
  int var__a;
  int len;
  char trim_ch_local;
  char *src_local;
  int dest_sz_local;
  char *dest_local;
  
  iVar1 = sx_strlen(src);
  local_40 = dest_sz + -1;
  if (iVar1 < local_40) {
    local_40 = iVar1;
  }
  local_38 = 0;
  for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
    if (trim_ch != src[local_3c]) {
      dest[local_38] = src[local_3c];
      local_38 = local_38 + 1;
    }
  }
  dest[local_38] = '\0';
  return dest;
}

Assistant:

char* sx_trimchar(char* dest, int dest_sz, const char* src, char trim_ch)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        if (trim_ch != src[i])
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}